

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line.c
# Opt level: O0

char * linetostr(line *ln)

{
  int iVar1;
  char *line;
  int len;
  line *ln_local;
  
  iVar1 = ln->l_used;
  if (iVar1 == 0x7fffffff) {
    ln_local = (line *)0x0;
  }
  else {
    ln_local = (line *)malloc((long)(iVar1 + 1));
    if (ln_local == (line *)0x0) {
      ln_local = (line *)0x0;
    }
    else {
      memcpy(ln_local,ln->l_text,(long)iVar1);
      *(undefined1 *)((long)&ln_local->l_fp + (long)iVar1) = 0;
    }
  }
  return (char *)ln_local;
}

Assistant:

char *
linetostr(const struct line *ln)
{
	int	 len;
	char	*line;

	len = llength(ln);
	if (len == INT_MAX)  /* (len + 1) overflow */
		return (NULL);

	if ((line = malloc(len + 1)) == NULL)
		return (NULL);

	(void)memcpy(line, ltext(ln), len);
	line[len] = '\0';

	return (line);
}